

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_search.c
# Opt level: O2

void rd_pick_4partition(AV1_COMP *cpi,ThreadData_conflict *td,TileDataEnc *tile_data,TokenExtra **tp
                       ,MACROBLOCK *x,RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,PC_TREE *pc_tree,
                       PICK_MODE_CONTEXT **cur_part_ctx,PartitionSearchState *part_search_state,
                       RD_STATS *best_rdc,int *inc_step,PARTITION_TYPE partition_type)

{
  RD_STATS *sum_rdc;
  BLOCK_SIZE bsize;
  int mi_row;
  int mi_col;
  int iVar1;
  int64_t iVar2;
  int64_t iVar3;
  undefined7 uVar4;
  BLOCK_SIZE subsize;
  int iVar5;
  PICK_MODE_CONTEXT *pPVar6;
  int iVar7;
  int iVar8;
  PART4_TYPES i;
  long lVar9;
  undefined8 local_60;
  int mi_pos [4] [2];
  
  mi_row = (part_search_state->part_blk_params).mi_row;
  mi_col = (part_search_state->part_blk_params).mi_col;
  bsize = (part_search_state->part_blk_params).bsize;
  local_60._0_4_ = (cpi->common).mi_params.mi_rows;
  local_60._4_4_ = (cpi->common).mi_params.mi_cols;
  subsize = get_partition_subsize(bsize,partition_type);
  (part_search_state->sum_rdc).rate = 0;
  (part_search_state->sum_rdc).zero_rate = 0;
  sum_rdc = &part_search_state->sum_rdc;
  (part_search_state->sum_rdc).sse = 0;
  (part_search_state->sum_rdc).dist = 0;
  (part_search_state->sum_rdc).rdcost = 0;
  (part_search_state->sum_rdc).skip_txfm = '\x01';
  iVar5 = part_search_state->partition_cost[partition_type];
  (part_search_state->sum_rdc).rate = iVar5;
  (part_search_state->sum_rdc).rdcost = (long)x->rdmult * (long)iVar5 + 0x100 >> 9;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    pPVar6 = av1_alloc_pmc(cpi,subsize,&td->shared_coeff_buf);
    cur_part_ctx[lVar9] = pPVar6;
    if (pPVar6 == (PICK_MODE_CONTEXT *)0x0) {
      aom_internal_error((x->e_mbd).error_info,AOM_CODEC_MEM_ERROR,
                         "Failed to allocate PICK_MODE_CONTEXT");
    }
  }
  iVar5 = *inc_step;
  iVar1 = inc_step[1];
  iVar7 = mi_row;
  iVar8 = mi_col;
  for (lVar9 = 0; lVar9 != 4; lVar9 = lVar9 + 1) {
    mi_pos[lVar9][0] = iVar7;
    mi_pos[lVar9][1] = iVar8;
    iVar8 = iVar8 + iVar1;
    iVar7 = iVar7 + iVar5;
  }
  lVar9 = 0;
  do {
    if ((lVar9 != 0) &&
       ((lVar9 == 4 || (mi_pos[-1][partition_type != '\b'] <= mi_pos[lVar9][partition_type != '\b'])
        ))) goto LAB_001cc6ff;
    pPVar6 = cur_part_ctx[lVar9];
    pPVar6->rd_mode_is_ready = 0;
    iVar5 = rd_try_subblock(cpi,td,tile_data,tp,(uint)(lVar9 == 3),mi_pos[lVar9][0],mi_pos[lVar9][1]
                            ,subsize,*best_rdc,sum_rdc,partition_type,pPVar6);
    lVar9 = lVar9 + 1;
  } while (iVar5 != 0);
  (part_search_state->sum_rdc).rate = 0x7fffffff;
  (part_search_state->sum_rdc).zero_rate = 0;
  (part_search_state->sum_rdc).dist = 0x7fffffffffffffff;
  (part_search_state->sum_rdc).rdcost = 0x7fffffffffffffff;
  (part_search_state->sum_rdc).sse = 0x7fffffffffffffff;
  (part_search_state->sum_rdc).skip_txfm = '\0';
LAB_001cc6ff:
  av1_rd_cost_update(x->rdmult,sum_rdc);
  if ((part_search_state->sum_rdc).rdcost < best_rdc->rdcost) {
    uVar4 = *(undefined7 *)&(part_search_state->sum_rdc).field_0x21;
    best_rdc->skip_txfm = (part_search_state->sum_rdc).skip_txfm;
    *(undefined7 *)&best_rdc->field_0x21 = uVar4;
    iVar5 = sum_rdc->rate;
    iVar1 = sum_rdc->zero_rate;
    iVar2 = (part_search_state->sum_rdc).dist;
    iVar3 = (part_search_state->sum_rdc).sse;
    best_rdc->rdcost = (part_search_state->sum_rdc).rdcost;
    best_rdc->sse = iVar3;
    best_rdc->rate = iVar5;
    best_rdc->zero_rate = iVar1;
    best_rdc->dist = iVar2;
    part_search_state->found_best_partition = true;
    pc_tree->partitioning = partition_type;
  }
  av1_restore_context(x,x_ctx,mi_row,mi_col,bsize,
                      (uint)(((cpi->common).seq_params)->monochrome == '\0') * 2 + 1);
  return;
}

Assistant:

static void rd_pick_4partition(
    AV1_COMP *const cpi, ThreadData *td, TileDataEnc *tile_data,
    TokenExtra **tp, MACROBLOCK *x, RD_SEARCH_MACROBLOCK_CONTEXT *x_ctx,
    PC_TREE *pc_tree, PICK_MODE_CONTEXT *cur_part_ctx[SUB_PARTITIONS_PART4],
    PartitionSearchState *part_search_state, RD_STATS *best_rdc,
    const int inc_step[NUM_PART4_TYPES], PARTITION_TYPE partition_type) {
  const AV1_COMMON *const cm = &cpi->common;
  PartitionBlkParams blk_params = part_search_state->part_blk_params;
  // mi positions needed for HORZ4 and VERT4 partition types.
  int mi_pos_check[NUM_PART4_TYPES] = { cm->mi_params.mi_rows,
                                        cm->mi_params.mi_cols };
  const PART4_TYPES part4_idx = (partition_type != PARTITION_HORZ_4);
  int mi_pos[SUB_PARTITIONS_PART4][2];

  blk_params.subsize = get_partition_subsize(blk_params.bsize, partition_type);
  // Set partition context and RD cost.
  set_4_part_ctx_and_rdcost(x, cpi, td, cur_part_ctx, part_search_state,
                            partition_type, blk_params.bsize);
  // Set mi positions for sub-block sizes.
  set_mi_pos_partition4(inc_step, mi_pos, blk_params.mi_row, blk_params.mi_col);
#if CONFIG_COLLECT_PARTITION_STATS
  PartitionTimingStats *part_timing_stats =
      &part_search_state->part_timing_stats;
  if (best_rdc->rdcost - part_search_state->sum_rdc.rdcost >= 0) {
    start_partition_block_timer(part_timing_stats, partition_type);
  }
#endif
  // Loop over sub-block partitions.
  for (PART4_TYPES i = 0; i < SUB_PARTITIONS_PART4; ++i) {
    if (i > 0 && mi_pos[i][part4_idx] >= mi_pos_check[part4_idx]) break;

    // Sub-block evaluation of Horz4 / Vert4 partition type.
    cur_part_ctx[i]->rd_mode_is_ready = 0;
    if (!rd_try_subblock(
            cpi, td, tile_data, tp, (i == SUB_PARTITIONS_PART4 - 1),
            mi_pos[i][0], mi_pos[i][1], blk_params.subsize, *best_rdc,
            &part_search_state->sum_rdc, partition_type, cur_part_ctx[i])) {
      av1_invalid_rd_stats(&part_search_state->sum_rdc);
      break;
    }
  }

  // Calculate the total cost and update the best partition.
  av1_rd_cost_update(x->rdmult, &part_search_state->sum_rdc);
  if (part_search_state->sum_rdc.rdcost < best_rdc->rdcost) {
    *best_rdc = part_search_state->sum_rdc;
    part_search_state->found_best_partition = true;
    pc_tree->partitioning = partition_type;
  }
#if CONFIG_COLLECT_PARTITION_STATS
  if (part_timing_stats->timer_is_on) {
    end_partition_block_timer(part_timing_stats, partition_type,
                              part_search_state->sum_rdc.rdcost);
  }
#endif
  av1_restore_context(x, x_ctx, blk_params.mi_row, blk_params.mi_col,
                      blk_params.bsize, av1_num_planes(cm));
}